

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

void __thiscall
pybind11::array::array<long>
          (array *this,ShapeContainer *shape,StridesContainer *strides,long *ptr,handle base)

{
  any_container<long> local_68;
  any_container<long> local_50;
  dtype local_38;
  long *local_30;
  long *ptr_local;
  StridesContainer *strides_local;
  ShapeContainer *shape_local;
  array *this_local;
  handle base_local;
  
  local_30 = ptr;
  ptr_local = (long *)strides;
  strides_local = shape;
  shape_local = (ShapeContainer *)this;
  this_local = (array *)base.m_ptr;
  dtype::of<long>();
  detail::any_container<long>::any_container(&local_50,shape);
  detail::any_container<long>::any_container(&local_68,strides);
  array(this,&local_38,&local_50,&local_68,local_30,(handle)this_local);
  detail::any_container<long>::~any_container(&local_68);
  detail::any_container<long>::~any_container(&local_50);
  dtype::~dtype(&local_38);
  return;
}

Assistant:

array(ShapeContainer shape, StridesContainer strides, const T *ptr, handle base = handle())
        : array(pybind11::dtype::of<T>(), std::move(shape), std::move(strides), ptr, base) { }